

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_live_fetching.c
# Opt level: O0

int main(void)

{
  aspa_array *paVar1;
  _Bool _Var2;
  int iVar3;
  long in_FS_OFFSET;
  uint local_158;
  uint local_154;
  uint32_t j;
  uint32_t i;
  aspa_array *array;
  int sleep_counter;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  tr_tcp_config tcp_config;
  tr_socket tr_tcp;
  undefined1 auStack_48 [3];
  char RPKI_CACHE_PORT [5];
  rtr_mgr_group groups [1];
  spki_table *local_28;
  char RPKI_CACHE_HOST [22];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (spki_table *)0x742e62616c727472;
  builtin_strncpy(RPKI_CACHE_HOST,"anneberger.me",0xe);
  tr_tcp.ident_fp._3_4_ = 0x35323333;
  tr_tcp.ident_fp._7_1_ = 0;
  rtr_tcp._120_8_ = &local_28;
  tcp_config.host = (char *)((long)&tr_tcp.ident_fp + 3);
  tcp_config.port = (char *)0x0;
  tcp_config.bindaddr = (char *)0x0;
  tcp_config.data = (void *)0x0;
  tcp_config.new_socket._0_4_ = 0;
  tr_tcp_init((tr_tcp_config *)&rtr_tcp.is_resetting,(tr_socket *)&tcp_config.connect_timeout);
  conf = (rtr_mgr_config *)&tcp_config.connect_timeout;
  _auStack_48 = (rtr_socket **)malloc(8);
  *_auStack_48 = (rtr_socket *)&conf;
  iVar3 = rtr_mgr_init((rtr_mgr_config **)&sleep_counter,(rtr_mgr_group *)auStack_48,1,
                       connection_status_callback,(void *)0x0);
  if (iVar3 < 0) {
    array._4_4_ = 1;
  }
  else {
    iVar3 = rtr_mgr_add_roa_support(_sleep_counter,(pfx_update_fp)0x0);
    if (iVar3 == -1) {
      fprintf(_stderr,"Failed initializing ROA support\n");
    }
    iVar3 = rtr_mgr_add_aspa_support(_sleep_counter,(aspa_update_fp)0x0);
    if (iVar3 == -1) {
      fprintf(_stderr,"Failed initializing ASPA support\n");
    }
    iVar3 = rtr_mgr_add_spki_support(_sleep_counter,(spki_update_fp)0x0);
    if (iVar3 == -1) {
      fprintf(_stderr,"Failed initializing BGPSEC support\n");
    }
    rtr_mgr_setup_sockets(_sleep_counter,(rtr_mgr_group *)auStack_48,1,0x32,600,600);
    rtr_mgr_start(_sleep_counter);
    array._0_4_ = 0;
    do {
      _Var2 = rtr_mgr_conf_in_sync(_sleep_counter);
      if (((_Var2 ^ 0xffU) & 1) == 0) {
        paVar1 = (*_auStack_48)->aspa_table->store->aspa_array;
        printf("ASPA:\n");
        for (local_154 = 0; local_154 < paVar1->size; local_154 = local_154 + 1) {
          printf("CAS %u => [ ",(ulong)paVar1->data[local_154].customer_asn);
          for (local_158 = 0; (ulong)local_158 < paVar1->data[local_154].provider_count;
              local_158 = local_158 + 1) {
            printf("%u",(ulong)paVar1->data[local_154].provider_asns[local_158]);
            if ((ulong)local_158 < paVar1->data[local_154].provider_count - 1) {
              printf(", ");
            }
          }
          printf(" ]\n");
        }
        rtr_mgr_stop(_sleep_counter);
        rtr_mgr_free(_sleep_counter);
        array._4_4_ = 0;
        goto LAB_001058cb;
      }
      if (connection_status == RTR_MGR_ERROR) {
        array._4_4_ = 1;
        goto LAB_001058cb;
      }
      sleep(1);
      array._0_4_ = (int)array + 1;
    } while ((int)array < 0x14);
    array._4_4_ = 1;
  }
LAB_001058cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return array._4_4_;
}

Assistant:

int main(void)
{
	/* These variables are not in the global scope
	 * because it would cause warnings about discarding constness
	 */

	//char RPKI_CACHE_HOST[] = "rpki-validator.realmv6.org";
	//char RPKI_CACHE_PORT[] = "8283";

	// REPLACE THIS BY YOUR RTR SERVER
	char RPKI_CACHE_HOST[] = "rtrlab.tanneberger.me";
	char RPKI_CACHE_PORT[] = "3325"; // rir rtr
	//char RPKI_CACHE_PORT[] = "3324"; // aspa rtr

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {RPKI_CACHE_HOST, RPKI_CACHE_PORT, NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct rtr_mgr_config *conf;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);
	rtr_mgr_start(conf);
	int sleep_counter = 0;
	/* wait for connection, or timeout and exit eventually */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_status == RTR_MGR_ERROR)
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout)
			return EXIT_FAILURE;
	}

	/* printing all fetched objects */
	struct aspa_array *array = ((*groups[0].sockets)->aspa_table->store)->aspa_array;

	printf("ASPA:\n");
	for (uint32_t i = 0; i < array->size; i++) {
		printf("CAS %u => [ ", array->data[i].customer_asn);
		for (uint32_t j = 0; j < array->data[i].provider_count; j++) {
			printf("%u", array->data[i].provider_asns[j]);
			if (j < array->data[i].provider_count - 1)
				printf(", ");
		}
		printf(" ]\n");
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);

	return EXIT_SUCCESS;
}